

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O2

void Hop_ObjCleanData_rec(Hop_Obj_t *pObj)

{
  uint uVar1;
  char *__assertion;
  
  if (((ulong)pObj & 1) != 0) {
    __assertion = "!Hop_IsComplement(pObj)";
    uVar1 = 0x5a;
LAB_00600099:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopUtil.c"
                  ,uVar1,"void Hop_ObjCleanData_rec(Hop_Obj_t *)");
  }
  uVar1 = *(uint *)&pObj->field_0x20 & 7;
  if (uVar1 == 4) {
    Hop_ObjCleanData_rec((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Hop_ObjCleanData_rec((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  }
  else if (uVar1 == 3) {
    __assertion = "!Hop_ObjIsPo(pObj)";
    uVar1 = 0x5b;
    goto LAB_00600099;
  }
  (pObj->field_0).pData = (void *)0x0;
  return;
}

Assistant:

void Hop_ObjCleanData_rec( Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    assert( !Hop_ObjIsPo(pObj) );
    if ( Hop_ObjIsAnd(pObj) )
    {
        Hop_ObjCleanData_rec( Hop_ObjFanin0(pObj) );
        Hop_ObjCleanData_rec( Hop_ObjFanin1(pObj) );
    }
    pObj->pData = NULL;
}